

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

int __thiscall QHexView::copy(QHexView *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QHexDocument *pQVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QHexBuffer *pQVar5;
  Data *pDVar6;
  bool bVar7;
  undefined8 uVar8;
  void *__buf;
  QByteArrayView QVar9;
  QByteArray bytes;
  undefined1 local_70 [16];
  QHexBuffer *pQStack_60;
  QByteArray local_58;
  QByteArray local_40;
  QByteArrayView local_28;
  
  uVar8 = QGuiApplication::clipboard();
  bVar7 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar7) {
    QHexCursor::selectedBytes((QByteArray *)local_70,this->m_hexcursor);
  }
  else {
    pQVar1 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)local_70,(int)pQVar1,__buf,1);
  }
  if ((char)dst != '\0') {
    QHexUtils::toHex(&local_58,(QByteArray *)local_70,' ');
    QByteArray::toUpper_helper(&local_40);
    pQVar5 = pQStack_60;
    uVar4 = local_70._8_8_;
    uVar3 = local_70._0_8_;
    local_70._0_8_ = local_40.d.d;
    local_40.d.d = (Data *)uVar3;
    local_70._8_8_ = local_40.d.ptr;
    pQStack_60 = (QHexBuffer *)local_40.d.size;
    local_40.d.ptr = (char *)uVar4;
    local_40.d.size = (qsizetype)pQVar5;
    if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar3,1,8);
      }
    }
    piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),1,8);
      }
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_28,(QByteArray *)local_70);
  QVar9.m_data = (storage_type *)local_28.m_size;
  QVar9.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar9);
  pDVar6 = local_40.d.d;
  local_58.d.d._0_1_ = local_40.d.d._0_1_;
  local_58.d.d._1_3_ = local_40.d.d._1_3_;
  local_58.d.d._4_4_ = local_40.d.d._4_4_;
  local_58.d.ptr._0_4_ = local_40.d.ptr._0_4_;
  local_58.d.ptr._4_4_ = local_40.d.ptr._4_4_;
  local_58.d.size = local_40.d.size;
  local_40.d.d = pDVar6;
  QClipboard::setText(uVar8,&local_58,0);
  piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,8);
    }
  }
  if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      local_70._0_8_ = QArrayData::deallocate((QArrayData *)local_70._0_8_,1,8);
    }
  }
  return (int)local_70._0_8_;
}

Assistant:

void QHexView::copy(bool hex) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    if(hex)
        bytes = QHexUtils::toHex(bytes, ' ').toUpper();
    c->setText(bytes);
}